

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.c
# Opt level: O1

_Bool str_ends_with(char *haystack,char *needle)

{
  int iVar1;
  size_t sVar2;
  size_t __n;
  _Bool _Var3;
  
  if (haystack == (char *)0x0) {
    __assert_fail("haystack != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                  ,0x233,"_Bool str_ends_with(const char *, const char *)");
  }
  if (needle != (char *)0x0) {
    sVar2 = strlen(haystack);
    __n = strlen(needle);
    if (sVar2 < __n) {
      _Var3 = false;
    }
    else {
      iVar1 = strncmp(haystack + (sVar2 - __n),needle,__n);
      _Var3 = iVar1 == 0;
    }
    return _Var3;
  }
  __assert_fail("needle != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                ,0x234,"_Bool str_ends_with(const char *, const char *)");
}

Assistant:

bool str_ends_with(const char *haystack, const char *needle)
{
    assert(haystack != NULL);
    assert(needle != NULL);

    size_t lens = strlen(haystack);
    size_t lenneedle = strlen(needle);

    if (lenneedle > lens)
        return false;

    return !strncmp(&haystack[lens - lenneedle], needle, lenneedle);
}